

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O1

void __thiscall
de::details::
UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
reset(UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
      *this)

{
  DescriptorSetUpdateBuilder *this_00;
  pointer pVVar1;
  pointer pVVar2;
  
  this_00 = (this->m_data).ptr;
  if (this_00 != (DescriptorSetUpdateBuilder *)0x0) {
    pVVar1 = (this_00->m_copies).
             super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pVVar1 != (pointer)0x0) {
      operator_delete(pVVar1,(long)(this_00->m_copies).
                                   super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1
                     );
    }
    pVVar2 = (this_00->m_writes).
             super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pVVar2 != (pointer)0x0) {
      operator_delete(pVVar2,(long)(this_00->m_writes).
                                   super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2
                     );
    }
    std::
    vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ::~vector(&this_00->m_writeDescriptorInfos);
    operator_delete(this_00,0x48);
    (this->m_data).ptr = (DescriptorSetUpdateBuilder *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}